

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O3

void __thiscall ncnn::Convolution::~Convolution(Convolution *this)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Convolution_00145d00;
  if (this->quantize != (Layer *)0x0) {
    (*this->quantize->_vptr_Layer[1])();
  }
  if (this->dequantize != (Layer *)0x0) {
    (*this->dequantize->_vptr_Layer[1])();
  }
  piVar1 = (this->bias_data).refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      pvVar2 = (this->bias_data).data;
      pAVar3 = (this->bias_data).allocator;
      if (pAVar3 == (Allocator *)0x0) {
        if (pvVar2 != (void *)0x0) {
          free(*(void **)((long)pvVar2 + -8));
        }
      }
      else {
        (**(code **)(*(long *)pAVar3 + 8))();
      }
    }
  }
  (this->bias_data).data = (void *)0x0;
  (this->bias_data).refcount = (int *)0x0;
  (this->bias_data).elemsize = 0;
  (this->bias_data).cstep = 0;
  (this->bias_data).dims = 0;
  (this->bias_data).w = 0;
  (this->bias_data).h = 0;
  (this->bias_data).c = 0;
  piVar1 = (this->weight_data).refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      pvVar2 = (this->weight_data).data;
      pAVar3 = (this->weight_data).allocator;
      if (pAVar3 == (Allocator *)0x0) {
        if (pvVar2 != (void *)0x0) {
          free(*(void **)((long)pvVar2 + -8));
        }
      }
      else {
        (**(code **)(*(long *)pAVar3 + 8))();
      }
    }
  }
  (this->weight_data).data = (void *)0x0;
  (this->weight_data).refcount = (int *)0x0;
  (this->weight_data).elemsize = 0;
  (this->weight_data).cstep = 0;
  (this->weight_data).dims = 0;
  (this->weight_data).w = 0;
  (this->weight_data).h = 0;
  (this->weight_data).c = 0;
  Layer::~Layer(&this->super_Layer);
  return;
}

Assistant:

Convolution::~Convolution()
{
    delete quantize;
    delete dequantize;
}